

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMU.cpp
# Opt level: O0

RTIMU * RTIMU::createIMU(RTIMUSettings *settings)

{
  bool bVar1;
  RTIMUSettings *settings_local;
  
  switch(*(undefined4 *)&(settings->super_RTIMUHal).field_0x1c) {
  case 0:
    bVar1 = RTIMUSettings::discoverIMU
                      (settings,(int *)&(settings->super_RTIMUHal).field_0x1c,
                       &(settings->super_RTIMUHal).m_busIsI2C,&settings->m_I2CSlaveAddress);
    if (bVar1) {
      (*(settings->super_RTIMUHal)._vptr_RTIMUHal[3])();
      settings_local = (RTIMUSettings *)createIMU(settings);
    }
    else {
      settings_local = (RTIMUSettings *)operator_new(0x108);
      RTIMUNull::RTIMUNull((RTIMUNull *)settings_local,settings);
    }
    break;
  case 1:
    settings_local = (RTIMUSettings *)operator_new(0x108);
    RTIMUNull::RTIMUNull((RTIMUNull *)settings_local,settings);
    break;
  case 2:
    settings_local = (RTIMUSettings *)operator_new(0xe38);
    RTIMUMPU9150::RTIMUMPU9150((RTIMUMPU9150 *)settings_local,settings);
    break;
  case 3:
    settings_local = (RTIMUSettings *)operator_new(0x110);
    RTIMUGD20HM303D::RTIMUGD20HM303D((RTIMUGD20HM303D *)settings_local,settings);
    break;
  case 4:
    settings_local = (RTIMUSettings *)operator_new(0x118);
    RTIMUGD20M303DLHC::RTIMUGD20M303DLHC((RTIMUGD20M303DLHC *)settings_local,settings);
    break;
  case 5:
    settings_local = (RTIMUSettings *)operator_new(0x110);
    RTIMULSM9DS0::RTIMULSM9DS0((RTIMULSM9DS0 *)settings_local,settings);
    break;
  case 6:
    settings_local = (RTIMUSettings *)operator_new(0x110);
    RTIMULSM9DS1::RTIMULSM9DS1((RTIMULSM9DS1 *)settings_local,settings);
    break;
  case 7:
    settings_local = (RTIMUSettings *)operator_new(0xe30);
    RTIMUMPU9250::RTIMUMPU9250((RTIMUMPU9250 *)settings_local,settings);
    break;
  case 8:
    settings_local = (RTIMUSettings *)operator_new(0x118);
    RTIMUGD20HM303DLHC::RTIMUGD20HM303DLHC((RTIMUGD20HM303DLHC *)settings_local,settings);
    break;
  case 9:
    settings_local = (RTIMUSettings *)operator_new(0x120);
    RTIMUBMX055::RTIMUBMX055((RTIMUBMX055 *)settings_local,settings);
    break;
  case 10:
    settings_local = (RTIMUSettings *)operator_new(0x110);
    RTIMUBNO055::RTIMUBNO055((RTIMUBNO055 *)settings_local,settings);
    break;
  default:
    settings_local = (RTIMUSettings *)0x0;
  }
  return (RTIMU *)settings_local;
}

Assistant:

RTIMU *RTIMU::createIMU(RTIMUSettings *settings)
{
    switch (settings->m_imuType) {
    case RTIMU_TYPE_MPU9150:
        return new RTIMUMPU9150(settings);

    case RTIMU_TYPE_GD20HM303D:
        return new RTIMUGD20HM303D(settings);

    case RTIMU_TYPE_GD20M303DLHC:
        return new RTIMUGD20M303DLHC(settings);

    case RTIMU_TYPE_LSM9DS0:
        return new RTIMULSM9DS0(settings);
    case RTIMU_TYPE_LSM9DS1:
        return new RTIMULSM9DS1(settings);

    case RTIMU_TYPE_MPU9250:
        return new RTIMUMPU9250(settings);

    case RTIMU_TYPE_GD20HM303DLHC:
        return new RTIMUGD20HM303DLHC(settings);

    case RTIMU_TYPE_BMX055:
        return new RTIMUBMX055(settings);

    case RTIMU_TYPE_BNO055:
        return new RTIMUBNO055(settings);

    case RTIMU_TYPE_AUTODISCOVER:
        if (settings->discoverIMU(settings->m_imuType, settings->m_busIsI2C, settings->m_I2CSlaveAddress)) {
            settings->saveSettings();
            return RTIMU::createIMU(settings);
        }
        return new RTIMUNull(settings);

    case RTIMU_TYPE_NULL:
        return new RTIMUNull(settings);

    default:
        return NULL;
    }
}